

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

BigNumber * __thiscall BigNumber::operator=(BigNumber *this,BigNumber *nb)

{
  BigNumber *nb_local;
  BigNumber *this_local;
  
  this->m_base = nb->m_base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb);
  return this;
}

Assistant:

BigNumber& BigNumber::operator = (BigNumber nb){
    this->m_base = nb.m_base;
    this->m_coef.clear();
    this->m_coef = nb.m_coef;
    return *this;
}